

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_comparison_suite.cpp
# Opt level: O0

void equality_suite::compare_integer_equal_boolean(void)

{
  int value;
  uint value_00;
  undefined1 local_989;
  basic_variable<std::allocator<char>_> local_988;
  undefined1 local_94b [2];
  undefined1 local_949;
  basic_variable<std::allocator<char>_> local_948;
  undefined1 local_90b [2];
  undefined1 local_909;
  basic_variable<std::allocator<char>_> local_908;
  undefined1 local_8cb [2];
  undefined1 local_8c9;
  basic_variable<std::allocator<char>_> local_8c8;
  undefined1 local_88a [2];
  undefined1 local_888 [8];
  variable big_1;
  undefined1 local_849;
  basic_variable<std::allocator<char>_> local_848;
  basic_variable<std::allocator<char>_> local_818;
  undefined1 local_7db [2];
  undefined1 local_7d9;
  basic_variable<std::allocator<char>_> local_7d8;
  basic_variable<std::allocator<char>_> local_7a8;
  undefined1 local_76b [2];
  undefined1 local_769;
  basic_variable<std::allocator<char>_> local_768;
  basic_variable<std::allocator<char>_> local_738;
  undefined1 local_6fb [2];
  undefined1 local_6f9;
  basic_variable<std::allocator<char>_> local_6f8;
  basic_variable<std::allocator<char>_> local_6c8;
  undefined1 local_68b [2];
  undefined1 local_689;
  basic_variable<std::allocator<char>_> local_688;
  basic_variable<std::allocator<char>_> local_658;
  undefined1 local_61b [2];
  undefined1 local_619;
  basic_variable<std::allocator<char>_> local_618;
  basic_variable<std::allocator<char>_> local_5e8;
  undefined1 local_5ab [2];
  undefined1 local_5a9;
  basic_variable<std::allocator<char>_> local_5a8;
  basic_variable<std::allocator<char>_> local_578;
  undefined1 local_53b [2];
  undefined1 local_539;
  basic_variable<std::allocator<char>_> local_538;
  basic_variable<std::allocator<char>_> local_508;
  undefined1 local_4cb [2];
  undefined1 local_4c9;
  basic_variable<std::allocator<char>_> local_4c8;
  undefined1 local_48b [2];
  undefined1 local_489;
  basic_variable<std::allocator<char>_> local_488;
  undefined1 local_44b [2];
  undefined1 local_449;
  basic_variable<std::allocator<char>_> local_448;
  undefined1 local_40b [2];
  undefined1 local_409;
  basic_variable<std::allocator<char>_> local_408;
  undefined1 local_3ca [2];
  undefined1 local_3c8 [8];
  variable big;
  undefined1 local_389;
  basic_variable<std::allocator<char>_> local_388;
  basic_variable<std::allocator<char>_> local_358;
  undefined1 local_31b [2];
  undefined1 local_319;
  basic_variable<std::allocator<char>_> local_318;
  basic_variable<std::allocator<char>_> local_2e8;
  undefined1 local_2ab [2];
  undefined1 local_2a9;
  basic_variable<std::allocator<char>_> local_2a8;
  basic_variable<std::allocator<char>_> local_278;
  undefined1 local_23b [2];
  undefined1 local_239;
  basic_variable<std::allocator<char>_> local_238;
  basic_variable<std::allocator<char>_> local_208;
  undefined1 local_1cb [2];
  undefined1 local_1c9;
  basic_variable<std::allocator<char>_> local_1c8;
  basic_variable<std::allocator<char>_> local_198;
  undefined1 local_15b [2];
  undefined1 local_159;
  basic_variable<std::allocator<char>_> local_158;
  basic_variable<std::allocator<char>_> local_128;
  undefined1 local_eb [2];
  undefined1 local_e9;
  basic_variable<std::allocator<char>_> local_e8;
  basic_variable<std::allocator<char>_> local_b8;
  undefined1 local_87 [2];
  undefined1 local_85 [13];
  basic_variable<std::allocator<char>_> local_78;
  basic_variable<std::allocator<char>_> local_48;
  undefined1 local_a [2];
  
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_48,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_78,false);
  local_a[0] = trial::dynamic::operator==(&local_48,&local_78);
  local_85[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) == variable(false)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1e1,"void equality_suite::compare_integer_equal_boolean()",local_a,local_85);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_78);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_48);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_b8,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_e8,false);
  local_87[0] = trial::dynamic::operator!=(&local_b8,&local_e8);
  local_e9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) != variable(false)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1e2,"void equality_suite::compare_integer_equal_boolean()",local_87,&local_e9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_b8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_128,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_158,true);
  local_eb[0] = trial::dynamic::operator==(&local_128,&local_158);
  local_159 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) == variable(true)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1e3,"void equality_suite::compare_integer_equal_boolean()",local_eb,&local_159);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_128);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_198,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_1c8,true);
  local_15b[0] = trial::dynamic::operator!=(&local_198,&local_1c8);
  local_1c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0) != variable(true)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1e4,"void equality_suite::compare_integer_equal_boolean()",local_15b,&local_1c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_208,1);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_238,false);
  local_1cb[0] = trial::dynamic::operator==(&local_208,&local_238);
  local_239 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) == variable(false)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1e6,"void equality_suite::compare_integer_equal_boolean()",local_1cb,&local_239);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_208);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_278,1);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_2a8,false);
  local_23b[0] = trial::dynamic::operator!=(&local_278,&local_2a8);
  local_2a9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) != variable(false)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1e7,"void equality_suite::compare_integer_equal_boolean()",local_23b,&local_2a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_2e8,1);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_318,true);
  local_2ab[0] = trial::dynamic::operator==(&local_2e8,&local_318);
  local_319 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) == variable(true)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1e8,"void equality_suite::compare_integer_equal_boolean()",local_2ab,&local_319);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_318);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_2e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(&local_358,1);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_388,true);
  local_31b[0] = trial::dynamic::operator!=(&local_358,&local_388);
  local_389 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1) != variable(true)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1e9,"void equality_suite::compare_integer_equal_boolean()",local_31b,&local_389);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_388);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_358);
  value = std::numeric_limits<int>::max();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>
            ((basic_variable<std::allocator<char>_> *)local_3c8,value);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_408,false);
  local_3ca[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)local_3c8,&local_408);
  local_409 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("big == variable(false)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1ec,"void equality_suite::compare_integer_equal_boolean()",local_3ca,&local_409);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_408);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_448,false);
  local_40b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)local_3c8,&local_448);
  local_449 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("big != variable(false)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1ed,"void equality_suite::compare_integer_equal_boolean()",local_40b,&local_449);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_448);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_488,true);
  local_44b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)local_3c8,&local_488);
  local_489 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("big == variable(true)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1ee,"void equality_suite::compare_integer_equal_boolean()",local_44b,&local_489);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_488);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_4c8,true);
  local_48b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)local_3c8,&local_4c8);
  local_4c9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("big != variable(true)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1ef,"void equality_suite::compare_integer_equal_boolean()",local_48b,&local_4c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_4c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_3c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_508,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_538,false);
  local_4cb[0] = trial::dynamic::operator==(&local_508,&local_538);
  local_539 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0U) == variable(false)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f2,"void equality_suite::compare_integer_equal_boolean()",local_4cb,&local_539);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_538);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_508);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_578,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_5a8,false);
  local_53b[0] = trial::dynamic::operator!=(&local_578,&local_5a8);
  local_5a9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0U) != variable(false)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,499,"void equality_suite::compare_integer_equal_boolean()",local_53b,&local_5a9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_578);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_5e8,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_618,true);
  local_5ab[0] = trial::dynamic::operator==(&local_5e8,&local_618);
  local_619 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0U) == variable(true)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,500,"void equality_suite::compare_integer_equal_boolean()",local_5ab,&local_619);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_618);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_5e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_658,0);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_688,true);
  local_61b[0] = trial::dynamic::operator!=(&local_658,&local_688);
  local_689 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(0U) != variable(true)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f5,"void equality_suite::compare_integer_equal_boolean()",local_61b,&local_689);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_688);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_658);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_6c8,1);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_6f8,false);
  local_68b[0] = trial::dynamic::operator==(&local_6c8,&local_6f8);
  local_6f9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1U) == variable(false)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f7,"void equality_suite::compare_integer_equal_boolean()",local_68b,&local_6f9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6f8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_6c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_738,1);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_768,false);
  local_6fb[0] = trial::dynamic::operator!=(&local_738,&local_768);
  local_769 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1U) != variable(false)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f8,"void equality_suite::compare_integer_equal_boolean()",local_6fb,&local_769);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_768);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_738);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_7a8,1);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_7d8,true);
  local_76b[0] = trial::dynamic::operator==(&local_7a8,&local_7d8);
  local_7d9 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1U) == variable(true)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1f9,"void equality_suite::compare_integer_equal_boolean()",local_76b,&local_7d9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_7a8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>(&local_818,1);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_848,true);
  local_7db[0] = trial::dynamic::operator!=(&local_818,&local_848);
  local_849 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("variable(1U) != variable(true)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fa,"void equality_suite::compare_integer_equal_boolean()",local_7db,&local_849);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_848);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_818);
  value_00 = std::numeric_limits<unsigned_int>::max();
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<unsigned_int>
            ((basic_variable<std::allocator<char>_> *)local_888,value_00);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_8c8,false);
  local_88a[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)local_888,&local_8c8);
  local_8c9 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("big == variable(false)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fd,"void equality_suite::compare_integer_equal_boolean()",local_88a,&local_8c9);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_8c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_908,false);
  local_8cb[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)local_888,&local_908);
  local_909 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("big != variable(false)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1fe,"void equality_suite::compare_integer_equal_boolean()",local_8cb,&local_909);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_908);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_948,true);
  local_90b[0] = trial::dynamic::operator==
                           ((basic_variable<std::allocator<char>_> *)local_888,&local_948);
  local_949 = 0;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("big == variable(true)","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x1ff,"void equality_suite::compare_integer_equal_boolean()",local_90b,&local_949);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_948);
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(&local_988,true);
  local_94b[0] = trial::dynamic::operator!=
                           ((basic_variable<std::allocator<char>_> *)local_888,&local_988);
  local_989 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("big != variable(true)","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_comparison_suite.cpp"
             ,0x200,"void equality_suite::compare_integer_equal_boolean()",local_94b,&local_989);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(&local_988);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_888);
  return;
}

Assistant:

void compare_integer_equal_boolean()
{
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) == variable(false), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) != variable(false), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) == variable(true), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0) != variable(true), true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) == variable(false), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) != variable(false), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) == variable(true), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1) != variable(true), false);

        const variable big(std::numeric_limits<signed int>::max());
        TRIAL_PROTOCOL_TEST_EQUAL(big == variable(false), false);
        TRIAL_PROTOCOL_TEST_EQUAL(big != variable(false), true);
        TRIAL_PROTOCOL_TEST_EQUAL(big == variable(true), false);
        TRIAL_PROTOCOL_TEST_EQUAL(big != variable(true), true);
    }
    {
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0U) == variable(false), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0U) != variable(false), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0U) == variable(true), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(0U) != variable(true), true);

        TRIAL_PROTOCOL_TEST_EQUAL(variable(1U) == variable(false), false);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1U) != variable(false), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1U) == variable(true), true);
        TRIAL_PROTOCOL_TEST_EQUAL(variable(1U) != variable(true), false);

        const variable big(std::numeric_limits<unsigned int>::max());
        TRIAL_PROTOCOL_TEST_EQUAL(big == variable(false), false);
        TRIAL_PROTOCOL_TEST_EQUAL(big != variable(false), true);
        TRIAL_PROTOCOL_TEST_EQUAL(big == variable(true), false);
        TRIAL_PROTOCOL_TEST_EQUAL(big != variable(true), true);
    }
}